

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

_Bool golf_level_save(golf_level_t *level,char *path)

{
  float fVar1;
  undefined8 uVar2;
  vec2 v;
  golf_entity_type_t gVar3;
  golf_material_t *pgVar4;
  golf_lightmap_image_t *pgVar5;
  golf_entity_t *pgVar6;
  golf_geo_point_t *pgVar7;
  golf_geo_generator_data_arg_t *pgVar8;
  int iVar9;
  JSON_Array *pJVar10;
  JSON_Value *pJVar11;
  JSON_Object *pJVar12;
  JSON_Value *pJVar13;
  JSON_Array *pJVar14;
  JSON_Array *array;
  JSON_Value *value;
  JSON_Object *pJVar15;
  long lVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  golf_geo_t *pgVar20;
  int iVar21;
  long lVar22;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *string;
  golf_movement_t *pgVar23;
  vec3 *pvVar24;
  double number;
  vec3 v_00;
  vec3 v_01;
  vec4 v_02;
  vec_int_t num_points_not_active;
  vec_int_t entity_saved_idx;
  vec_str_t data_dependencies;
  vec_char_t png_data;
  float local_198;
  char *local_178;
  int aiStack_170 [2];
  char *local_168;
  JSON_Object *local_158;
  JSON_Object *local_150;
  char *local_148;
  int aiStack_140 [2];
  char *local_138;
  vec_str_t local_128;
  JSON_Value *local_110;
  JSON_Value *local_108;
  JSON_Value *local_100;
  char *local_f8;
  JSON_Value *local_f0;
  JSON_Array *local_e8;
  JSON_Value *local_e0;
  JSON_Value *local_d8;
  long local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  long local_80;
  int local_78;
  uint local_68;
  long local_60;
  vec3 local_44;
  float fVar25;
  undefined8 uVar26;
  
  local_128.data = (char **)0x0;
  local_128.length = 0;
  local_128.capacity = 0;
  local_128.alloc_category = "level";
  local_f8 = path;
  _add_dependency(&local_128,"data/textures/hole_lightmap.png");
  local_100 = json_value_init_array();
  pJVar10 = json_value_get_array(local_100);
  if (0 < (level->materials).length) {
    lVar19 = 0x58;
    lVar22 = 0;
    do {
      pgVar4 = (level->materials).data;
      if (pgVar4->name[lVar19 + -0x59] != '\x01') goto LAB_0012b09e;
      pJVar11 = json_value_init_object();
      pJVar12 = json_value_get_object(pJVar11);
      json_object_set_string(pJVar12,"name",pgVar4->name + lVar19 + -0x58);
      json_object_set_number(pJVar12,"friction",(double)*(float *)(pgVar4->name + lVar19 + -0x15));
      json_object_set_number
                (pJVar12,"restitution",(double)*(float *)(pgVar4->name + lVar19 + -0x11));
      json_object_set_number(pJVar12,"vel_scale",(double)*(float *)(pgVar4->name + lVar19 + -0xd));
      switch(*(undefined4 *)(pgVar4->name + lVar19 + -9)) {
      case 0:
        json_object_set_string(pJVar12,"type","texture");
        break;
      case 1:
        json_object_set_string(pJVar12,"type","color");
        uVar2 = *(undefined8 *)(pgVar4->name + lVar19 + -1);
        uVar26 = *(undefined8 *)(pgVar4->name + lVar19 + 7);
        goto LAB_0012b087;
      case 2:
        json_object_set_string(pJVar12,"type","diffuse_color");
        uVar2 = *(undefined8 *)(pgVar4->name + lVar19 + -1);
        uVar26 = *(undefined8 *)(pgVar4->name + lVar19 + 7);
LAB_0012b087:
        v_02.z = (float)(int)uVar26;
        v_02.w = (float)(int)((ulong)uVar26 >> 0x20);
        v_02.x = (float)(int)uVar2;
        v_02.y = (float)(int)((ulong)uVar2 >> 0x20);
        golf_json_object_set_vec4(pJVar12,"color",v_02);
        goto switchD_0012afc9_default;
      case 3:
        json_object_set_string(pJVar12,"type","environment");
        break;
      default:
        goto switchD_0012afc9_default;
      }
      json_object_set_string(pJVar12,"texture",pgVar4->name + lVar19 + -1);
      _add_dependency(&local_128,pgVar4->name + lVar19 + -1);
switchD_0012afc9_default:
      json_array_append_value(pJVar10,pJVar11);
LAB_0012b09e:
      lVar22 = lVar22 + 1;
      lVar19 = lVar19 + 0x460;
    } while (lVar22 < (level->materials).length);
  }
  local_108 = json_value_init_array();
  pJVar10 = json_value_get_array(local_108);
  if (0 < (level->lightmap_images).length) {
    lVar19 = 0;
    do {
      pgVar5 = (level->lightmap_images).data;
      if (pgVar5[lVar19].active == true) {
        pJVar11 = json_value_init_object();
        pJVar12 = json_value_get_object(pJVar11);
        json_object_set_string(pJVar12,"name",pgVar5[lVar19].name);
        json_object_set_number(pJVar12,"resolution",(double)pgVar5[lVar19].resolution);
        json_object_set_number(pJVar12,"time_length",(double)pgVar5[lVar19].time_length);
        json_object_set_number(pJVar12,"num_samples",(double)pgVar5[lVar19].num_samples);
        json_object_set_boolean(pJVar12,"repeats",(uint)pgVar5[lVar19].repeats);
        pJVar13 = json_value_init_array();
        pJVar14 = json_value_get_array(pJVar13);
        if (0 < pgVar5[lVar19].num_samples) {
          lVar22 = 0;
          do {
            local_c8 = (uchar *)0x0;
            uStack_c0 = 0;
            local_b8 = "level";
            stbi_write_png_to_func
                      (_stbi_write_func,&local_c8,pgVar5[lVar19].width,pgVar5[lVar19].height,1,
                       pgVar5[lVar19].data[lVar22],pgVar5[lVar19].width);
            golf_json_array_append_data(pJVar14,local_c8,(int)uStack_c0);
            golf_free_tracked(local_c8);
            lVar22 = lVar22 + 1;
          } while (lVar22 < pgVar5[lVar19].num_samples);
        }
        json_object_set_value(pJVar12,"datas",pJVar13);
        json_array_append_value(pJVar10,pJVar11);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (level->lightmap_images).length);
  }
  local_148 = (char *)0x0;
  aiStack_140[0] = 0;
  aiStack_140[1] = 0;
  local_138 = "level";
  if (0 < (level->entities).length) {
    lVar19 = 0;
    lVar22 = 0;
    iVar21 = 0;
    do {
      iVar9 = vec_expand_(&local_148,aiStack_140,aiStack_140 + 1,4,local_138);
      if (iVar9 == 0) {
        lVar16 = (long)aiStack_140[0];
        aiStack_140[0] = aiStack_140[0] + 1;
        *(int *)(local_148 + lVar16 * 4) = iVar21;
      }
      iVar21 = iVar21 + (uint)(byte)((level->entities).data)->name[lVar19 + -0xc];
      lVar22 = lVar22 + 1;
      lVar19 = lVar19 + 0x510;
    } while (lVar22 < (level->entities).length);
  }
  local_110 = json_value_init_array();
  local_e8 = json_value_get_array(local_110);
  if (0 < (level->entities).length) {
    lVar19 = 0;
    do {
      pgVar6 = (level->entities).data;
      if (pgVar6[lVar19].active != true) goto LAB_0012bde4;
      local_d0 = lVar19;
      local_d8 = json_value_init_object();
      pJVar12 = json_value_get_object(local_d8);
      iVar21 = pgVar6[lVar19].parent_idx;
      if (-1 < (long)iVar21) {
        iVar21 = *(int *)(local_148 + (long)iVar21 * 4);
      }
      json_object_set_number(pJVar12,"parent_idx",(double)iVar21);
      json_object_set_string(pJVar12,"name",pgVar6[lVar19].name);
      switch(pgVar6[lVar19].type) {
      case MODEL_ENTITY:
        json_object_set_string(pJVar12,"type","model");
        pcVar18 = pgVar6[lVar19].field_4.model.model_path;
        json_object_set_string(pJVar12,"model",pcVar18);
        json_object_set_number(pJVar12,"uv_scale",(double)pgVar6[lVar19].field_4.model.uv_scale);
        json_object_set_boolean
                  (pJVar12,"ignore_physics",(uint)pgVar6[lVar19].field_4.model.ignore_physics);
        _add_dependency(&local_128,pcVar18);
        goto switchD_0012b3b5_default;
      case BALL_START_ENTITY:
        pcVar18 = "ball-start";
        break;
      case HOLE_ENTITY:
        pcVar18 = "hole";
        break;
      case GEO_ENTITY:
        pcVar18 = "geo";
        break;
      case WATER_ENTITY:
        pcVar18 = "water";
        break;
      case GROUP_ENTITY:
        pcVar18 = "group";
        break;
      case BEGIN_ANIMATION_ENTITY:
        pcVar18 = "begin_animation";
        break;
      case CAMERA_ZONE_ENTITY:
        json_object_set_string(pJVar12,"type","camera_zone");
        json_object_set_boolean
                  (pJVar12,"towards_hole",
                   (uint)(byte)pgVar6[lVar19].field_4.geo.lightmap_section.lightmap_name[0]);
      default:
        goto switchD_0012b3b5_default;
      }
      json_object_set_string(pJVar12,"type",pcVar18);
switchD_0012b3b5_default:
      if (pgVar6[lVar19].type == WATER_ENTITY) {
        pgVar20 = &pgVar6[lVar19].field_4.water.geo;
      }
      else if (pgVar6[lVar19].type == GEO_ENTITY) {
        pgVar20 = &pgVar6[lVar19].field_4.geo.geo;
      }
      else {
        pgVar20 = (golf_geo_t *)0x0;
      }
      if (pgVar20 != (golf_geo_t *)0x0) {
        local_e0 = json_value_init_object();
        local_150 = json_value_get_object(local_e0);
        local_178 = (char *)0x0;
        aiStack_170[0] = 0;
        aiStack_170[1] = 0;
        local_168 = "geo";
        if (0 < (pgVar20->points).length) {
          lVar22 = 0;
          lVar16 = 0;
          iVar21 = 0;
          do {
            iVar9 = vec_expand_(&local_178,aiStack_170,aiStack_170 + 1,4,local_168);
            if (iVar9 == 0) {
              lVar17 = (long)aiStack_170[0];
              aiStack_170[0] = aiStack_170[0] + 1;
              *(int *)(local_178 + lVar17 * 4) = iVar21;
            }
            iVar21 = iVar21 + (~*(uint *)(&((pgVar20->points).data)->active + lVar22) & 1);
            lVar16 = lVar16 + 1;
            lVar22 = lVar22 + 0x10;
          } while (lVar16 < (pgVar20->points).length);
        }
        pJVar11 = json_value_init_array();
        pJVar10 = json_value_get_array(pJVar11);
        if (0 < (pgVar20->points).length) {
          lVar22 = 0xc;
          lVar16 = 0;
          do {
            pgVar7 = (pgVar20->points).data;
            if ((*(byte *)((long)pgVar7 + lVar22 + -0xc) & 1) != 0) {
              fVar25 = *(float *)((long)pgVar7 + lVar22 + -4);
              fVar1 = *(float *)(&pgVar7->active + lVar22);
              json_array_append_number(pJVar10,(double)*(float *)((long)pgVar7 + lVar22 + -8));
              json_array_append_number(pJVar10,(double)fVar25);
              json_array_append_number(pJVar10,(double)fVar1);
            }
            lVar16 = lVar16 + 1;
            lVar22 = lVar22 + 0x10;
          } while (lVar16 < (pgVar20->points).length);
        }
        json_object_set_value(local_150,"p",pJVar11);
        local_158 = (JSON_Object *)json_value_init_array();
        pJVar10 = json_value_get_array((JSON_Value *)local_158);
        if (0 < (pgVar20->faces).length) {
          lVar22 = 0;
          do {
            memcpy(&local_c8,(pgVar20->faces).data + lVar22,0x90);
            if ((char)local_c8 == '\x01') {
              pJVar11 = json_value_init_array();
              pJVar14 = json_value_get_array(pJVar11);
              pJVar13 = json_value_init_array();
              array = json_value_get_array(pJVar13);
              if (0 < local_78) {
                lVar16 = 0;
                do {
                  iVar21 = *(int *)(local_80 + lVar16 * 4);
                  json_array_append_number
                            (pJVar14,(double)(iVar21 - *(int *)(local_178 + (long)iVar21 * 4)));
                  fVar25 = *(float *)(local_60 + 4 + lVar16 * 8);
                  json_array_append_number(array,(double)*(float *)(local_60 + lVar16 * 8));
                  json_array_append_number(array,(double)fVar25);
                  lVar16 = lVar16 + 1;
                } while (lVar16 < local_78);
              }
              value = json_value_init_object();
              pJVar15 = json_value_get_object(value);
              json_object_set_string(pJVar15,"material_name",(char *)((long)&local_c8 + 1));
              json_object_set_value(pJVar15,"idxs",pJVar11);
              json_object_set_value(pJVar15,"uvs",pJVar13);
              json_object_set_string
                        (pJVar15,"uv_gen_type",_golf_geo_face_uv_gen_type_strings[local_68]);
              json_array_append_value(pJVar10,value);
              golf_json_object_set_vec3(pJVar15,"water_dir",local_44);
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < (pgVar20->faces).length);
        }
        json_object_set_value(local_150,"faces",(JSON_Value *)local_158);
        if ((pgVar20->generator_data).script != (golf_script_t *)0x0) {
          pJVar11 = json_value_init_object();
          local_158 = json_value_get_object(pJVar11);
          json_object_set_string(local_158,"script",((pgVar20->generator_data).script)->path);
          local_f0 = json_value_init_array();
          pJVar10 = json_value_get_array(local_f0);
          if (0 < (pgVar20->generator_data).args.length) {
            lVar16 = 0;
            lVar22 = 0;
            do {
              pJVar13 = json_value_init_object();
              pJVar15 = json_value_get_object(pJVar13);
              json_object_set_string
                        (pJVar15,"name",((pgVar20->generator_data).args.data)->name + lVar16);
              pgVar8 = (pgVar20->generator_data).args.data;
              if (0xb < *(uint *)(pgVar8->name + lVar16 + 0x40)) goto LAB_0012b9a4;
              v = *(vec2 *)(pgVar8->name + lVar16 + 0x48);
              local_198 = v.x;
              switch(*(uint *)(pgVar8->name + lVar16 + 0x40)) {
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/level.c"
                              ,0x1ae,
                              "void _golf_json_object_set_geo(JSON_Object *, const char *, golf_geo_t *)"
                             );
              case 1:
                json_object_set_string(pJVar15,"type","bool");
                local_198 = (float)((uint)local_198 & 1);
                goto LAB_0012b98e;
              case 2:
                json_object_set_string(pJVar15,"type","int");
LAB_0012b98e:
                number = (double)(int)local_198;
LAB_0012b995:
                json_object_set_number(pJVar15,"val",number);
                break;
              case 3:
                json_object_set_string(pJVar15,"type","float");
                number = (double)local_198;
                goto LAB_0012b995;
              case 4:
                json_object_set_string(pJVar15,"type","vec2");
                golf_json_object_set_vec2(pJVar15,"val",v);
                break;
              case 5:
                fVar25 = *(float *)(pgVar8->name + lVar16 + 0x50);
                json_object_set_string(pJVar15,"type","vec3");
                v_00.z = fVar25;
                v_00.x = v.x;
                v_00.y = v.y;
                golf_json_object_set_vec3(pJVar15,"val",v_00);
              }
LAB_0012b9a4:
              json_array_append_value(pJVar10,pJVar13);
              lVar22 = lVar22 + 1;
              lVar16 = lVar16 + 0x58;
            } while (lVar22 < (pgVar20->generator_data).args.length);
          }
          json_object_set_value(local_158,"args",local_f0);
          json_object_set_value(local_150,"generator_data",pJVar11);
        }
        json_object_set_value(pJVar12,"geo",local_e0);
        golf_free_tracked(local_178);
      }
      switch(pgVar6[lVar19].type) {
      case MODEL_ENTITY:
      case BALL_START_ENTITY:
      case HOLE_ENTITY:
      case GROUP_ENTITY:
      case BEGIN_ANIMATION_ENTITY:
        pvVar24 = (vec3 *)&pgVar6[lVar19].field_4;
        break;
      case GEO_ENTITY:
      case WATER_ENTITY:
        pvVar24 = &pgVar6[lVar19].field_4.geo.transform.position;
        break;
      case CAMERA_ZONE_ENTITY:
        pvVar24 = (vec3 *)&pgVar6[lVar19].field_4.model.transform.position.y;
        break;
      default:
        pvVar24 = (vec3 *)0x0;
      }
      if (pvVar24 != (vec3 *)0x0) {
        pJVar11 = json_value_init_object();
        pJVar15 = json_value_get_object(pJVar11);
        golf_json_object_set_vec3(pJVar15,"position",*pvVar24);
        golf_json_object_set_vec3(pJVar15,"scale",*(vec3 *)&pvVar24[2].y);
        golf_json_object_set_quat(pJVar15,"rotation",*(quat *)(pvVar24 + 1));
        json_object_set_value(pJVar12,"transform",pJVar11);
      }
      gVar3 = pgVar6[lVar19].type;
      if ((gVar3 == WATER_ENTITY) || (gVar3 == GEO_ENTITY)) {
        string = &pgVar6[lVar19].field_4;
      }
      else if (gVar3 == MODEL_ENTITY) {
        string = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
                 &pgVar6[lVar19].field_4.model.lightmap_section;
      }
      else {
        string = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0;
      }
      if (string != (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0) {
        pJVar11 = json_value_init_object();
        pJVar15 = json_value_get_object(pJVar11);
        json_object_set_string(pJVar15,"lightmap_name",(char *)string);
        golf_json_object_set_float_array
                  (pJVar15,"uvs",&((vec_vec2_t *)((long)string + 0x40))->data->x,
                   *(int *)((long)string + 0x48) * 2,0.0,1.0);
        json_object_set_value(pJVar12,"lightmap_section",pJVar11);
      }
      if ((pgVar6[lVar19].type == GEO_ENTITY) || (pgVar6[lVar19].type == MODEL_ENTITY)) {
        pgVar23 = &pgVar6[lVar19].field_4.model.movement;
      }
      else {
        pgVar23 = (golf_movement_t *)0x0;
      }
      if (pgVar23 == (golf_movement_t *)0x0) goto LAB_0012bdc2;
      pJVar11 = json_value_init_object();
      pJVar15 = json_value_get_object(pJVar11);
      switch(pgVar23->type) {
      case GOLF_MOVEMENT_NONE:
        json_object_set_string(pJVar15,"type","none");
        break;
      case GOLF_MOVEMENT_LINEAR:
        json_object_set_string(pJVar15,"type","linear");
        json_object_set_number(pJVar15,"t0",(double)pgVar23->t0);
        json_object_set_number(pJVar15,"length",(double)pgVar23->length);
        golf_json_object_set_vec3(pJVar15,"p0",(pgVar23->field_4).linear.p0);
        uVar26 = *(undefined8 *)((long)&pgVar23->field_4 + 0xc);
        fVar25 = (pgVar23->field_4).linear.p1.z;
        pcVar18 = "p1";
        goto LAB_0012bda9;
      case GOLF_MOVEMENT_SPINNER:
        json_object_set_string(pJVar15,"type","spinner");
        json_object_set_number(pJVar15,"t0",(double)pgVar23->t0);
        json_object_set_number(pJVar15,"length",(double)pgVar23->length);
        break;
      case GOLF_MOVEMENT_PENDULUM:
        json_object_set_string(pJVar15,"type","pendulum");
        json_object_set_number(pJVar15,"t0",(double)pgVar23->t0);
        json_object_set_number(pJVar15,"length",(double)pgVar23->length);
        json_object_set_number(pJVar15,"theta0",(double)(pgVar23->field_4).linear.p0.x);
        uVar26 = *(undefined8 *)((long)&pgVar23->field_4 + 4);
        fVar25 = (pgVar23->field_4).linear.p1.x;
        goto LAB_0012bd26;
      case GOLF_MOVEMENT_RAMP:
        json_object_set_string(pJVar15,"type","ramp");
        json_object_set_number(pJVar15,"t0",(double)pgVar23->t0);
        json_object_set_number(pJVar15,"length",(double)pgVar23->length);
        json_object_set_number(pJVar15,"theta0",(double)(pgVar23->field_4).linear.p0.x);
        json_object_set_number(pJVar15,"theta1",(double)(pgVar23->field_4).linear.p0.y);
        json_object_set_number(pJVar15,"transition_length",(double)(pgVar23->field_4).linear.p0.z);
        uVar26 = *(undefined8 *)((long)&pgVar23->field_4 + 0xc);
        fVar25 = (pgVar23->field_4).linear.p1.z;
LAB_0012bd26:
        pcVar18 = "axis";
LAB_0012bda9:
        v_01.z = fVar25;
        v_01.x = (float)(int)uVar26;
        v_01.y = (float)(int)((ulong)uVar26 >> 0x20);
        golf_json_object_set_vec3(pJVar15,pcVar18,v_01);
      }
      json_object_set_value(pJVar12,"movement",pJVar11);
LAB_0012bdc2:
      json_array_append_value(local_e8,local_d8);
      lVar19 = local_d0;
LAB_0012bde4:
      lVar19 = lVar19 + 1;
    } while (lVar19 < (level->entities).length);
  }
  golf_free_tracked(local_148);
  pJVar11 = json_value_init_array();
  pJVar10 = json_value_get_array(pJVar11);
  if (0 < local_128.length) {
    lVar19 = 0;
    do {
      json_array_append_string(pJVar10,local_128.data[lVar19]);
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_128.length);
  }
  golf_free_tracked(local_128.data);
  pJVar13 = json_value_init_object();
  pJVar12 = json_value_get_object(pJVar13);
  json_object_set_value(pJVar12,"data_dependencies",pJVar11);
  json_object_set_value(pJVar12,"materials",local_100);
  json_object_set_value(pJVar12,"lightmap_images",local_108);
  json_object_set_value(pJVar12,"entities",local_110);
  json_serialize_to_file_pretty(pJVar13,local_f8);
  json_value_free(pJVar13);
  return true;
}

Assistant:

bool golf_level_save(golf_level_t *level, const char *path) {
    vec_str_t data_dependencies;
    vec_init(&data_dependencies, "level");
    _add_dependency(&data_dependencies, "data/textures/hole_lightmap.png");

    JSON_Value *json_materials_val = json_value_init_array();
    JSON_Array *json_materials_arr = json_value_get_array(json_materials_val);
    for (int i = 0; i < level->materials.length; i++) {
        golf_material_t *material = &level->materials.data[i];
        if (!material->active) continue;

        JSON_Value *json_material_val = json_value_init_object();
        JSON_Object *json_material_obj = json_value_get_object(json_material_val);
        json_object_set_string(json_material_obj, "name", material->name);
        json_object_set_number(json_material_obj, "friction", material->friction);
        json_object_set_number(json_material_obj, "restitution", material->restitution);
        json_object_set_number(json_material_obj, "vel_scale", material->vel_scale);

        switch (material->type) {
            case GOLF_MATERIAL_TEXTURE: {
                json_object_set_string(json_material_obj, "type", "texture");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
            case GOLF_MATERIAL_COLOR: {
                json_object_set_string(json_material_obj, "type", "color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_DIFFUSE_COLOR: {
                json_object_set_string(json_material_obj, "type", "diffuse_color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_ENVIRONMENT: {
                json_object_set_string(json_material_obj, "type", "environment");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
        }

        json_array_append_value(json_materials_arr, json_material_val);
    }

    JSON_Value *json_lightmap_images_val = json_value_init_array();
    JSON_Array *json_lightmap_images_arr = json_value_get_array(json_lightmap_images_val);
    for (int i = 0; i < level->lightmap_images.length; i++) {
        golf_lightmap_image_t *lightmap_image = &level->lightmap_images.data[i];
        if (!lightmap_image->active) continue;

        JSON_Value *json_lightmap_image_val = json_value_init_object();
        JSON_Object *json_lightmap_image_obj = json_value_get_object(json_lightmap_image_val);
        json_object_set_string(json_lightmap_image_obj, "name", lightmap_image->name);
        json_object_set_number(json_lightmap_image_obj, "resolution", lightmap_image->resolution);
        json_object_set_number(json_lightmap_image_obj, "time_length", lightmap_image->time_length);
        json_object_set_number(json_lightmap_image_obj, "num_samples", lightmap_image->num_samples);
        json_object_set_boolean(json_lightmap_image_obj, "repeats", lightmap_image->repeats);

        JSON_Value *datas_val = json_value_init_array();
        JSON_Array *datas_arr = json_value_get_array(datas_val);
        for (int s = 0; s < lightmap_image->num_samples; s++) {
            vec_char_t png_data;
            vec_init(&png_data, "level");
            stbi_write_png_to_func(_stbi_write_func, &png_data, lightmap_image->width, lightmap_image->height, 1, lightmap_image->data[s], lightmap_image->width);
            golf_json_array_append_data(datas_arr, (unsigned char*)png_data.data, sizeof(unsigned char) * png_data.length);
            vec_deinit(&png_data);
        }
        json_object_set_value(json_lightmap_image_obj, "datas", datas_val);

        json_array_append_value(json_lightmap_images_arr, json_lightmap_image_val);
    }

    vec_int_t entity_saved_idx;
    vec_init(&entity_saved_idx, "level");
    {
        int saved_idx = 0;
        for (int i = 0; i < level->entities.length; i++) {
            vec_push(&entity_saved_idx, saved_idx);
            if (level->entities.data[i].active) saved_idx++;
        }
    }

    JSON_Value *json_entities_val = json_value_init_array();
    JSON_Array *json_entities_arr = json_value_get_array(json_entities_val);
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (!entity->active) continue;

        JSON_Value *json_entity_val = json_value_init_object();
        JSON_Object *json_entity_obj = json_value_get_object(json_entity_val);

        int parent_idx = entity->parent_idx;
        if (parent_idx >= 0) {
            parent_idx = entity_saved_idx.data[parent_idx];
        }
        json_object_set_number(json_entity_obj, "parent_idx", parent_idx);
        json_object_set_string(json_entity_obj, "name", entity->name);
        switch (entity->type) {
            case MODEL_ENTITY: {
                golf_model_entity_t *model = &entity->model;
                json_object_set_string(json_entity_obj, "type", "model");
                json_object_set_string(json_entity_obj, "model", model->model_path);
                json_object_set_number(json_entity_obj, "uv_scale", model->uv_scale);
                json_object_set_boolean(json_entity_obj, "ignore_physics", model->ignore_physics);
                _add_dependency(&data_dependencies, model->model_path);
                break;
            }
            case BALL_START_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "ball-start");
                break;
            }
            case HOLE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "hole");
                break;
            }
            case GEO_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "geo");
                break;
            }
            case GROUP_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "group");
                break;
            }
            case WATER_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "water");
                break;
            }
            case BEGIN_ANIMATION_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "begin_animation");
                break;
            }
            case CAMERA_ZONE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "camera_zone");
                json_object_set_boolean(json_entity_obj, "towards_hole", entity->camera_zone.towards_hole);
                break;
            }
        }

        golf_geo_t *geo = golf_entity_get_geo(entity);
        if (geo) {
            _golf_json_object_set_geo(json_entity_obj, "geo", geo);
        }

        golf_transform_t *transform = golf_entity_get_transform(entity);
        if (transform) {
            _golf_json_object_set_transform(json_entity_obj, "transform", transform);
        }

        golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
        if (lightmap_section) {
            _golf_json_object_set_lightmap_section(json_entity_obj, "lightmap_section", lightmap_section);
        }

        golf_movement_t *movement = golf_entity_get_movement(entity);
        if (movement) {
            _golf_json_object_set_movement(json_entity_obj, "movement", movement);
        }

        json_array_append_value(json_entities_arr, json_entity_val);
    }

    vec_deinit(&entity_saved_idx);

    JSON_Value *json_data_dependencies_val = json_value_init_array();
    JSON_Array *json_data_dependencies_arr = json_value_get_array(json_data_dependencies_val);
    for (int i = 0; i < data_dependencies.length; i++) {
        json_array_append_string(json_data_dependencies_arr, data_dependencies.data[i]);
    }
    vec_deinit(&data_dependencies);

    JSON_Value *json_val = json_value_init_object();
    JSON_Object *json_obj = json_value_get_object(json_val);
    json_object_set_value(json_obj, "data_dependencies", json_data_dependencies_val);
    json_object_set_value(json_obj, "materials", json_materials_val);
    json_object_set_value(json_obj, "lightmap_images", json_lightmap_images_val);
    json_object_set_value(json_obj, "entities", json_entities_val);
    json_serialize_to_file_pretty(json_val, path);
    json_value_free(json_val);
    return true;
}